

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.cpp
# Opt level: O0

void __thiscall r_exec::HLPController::~HLPController(HLPController *this)

{
  HLPController *this_local;
  
  (this->super_OController).super_Controller.super__Object._vptr__Object =
       (_func_int **)&PTR__HLPController_002ec038;
  std::vector<core::P<r_exec::HLPController>,_std::allocator<core::P<r_exec::HLPController>_>_>::
  ~vector(&this->controllers);
  core::P<r_exec::HLPBindingMap>::~P(&this->bindings);
  Cache<r_exec::HLPController::PEEntry>::~Cache(&this->predicted_evidences);
  Cache<r_exec::HLPController::EEntry>::~Cache(&this->evidences);
  OController::~OController(&this->super_OController);
  return;
}

Assistant:

HLPController::~HLPController()
{
}